

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_representation.cpp
# Opt level: O2

void __thiscall mjs::value_representation::fixup(value_representation *this,gc_heap *old_heap)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  
  uVar2 = this->repr_;
  if ((uVar2 & 0xf000000000000) != 0 && (~uVar2 & 0x7ff0000000000000) == 0) {
    uVar3 = (ushort)(uVar2 >> 0x30) & 0xf;
    uVar1 = uVar3 - 1;
    if (3 < uVar1) {
      if (1 < uVar3 - 5) {
        abort();
      }
      if (((uint)(((ulong)uVar1 << 0x30) + 0x1000000000000 >> 0x20) | 0x7ff00000) ==
          (uint)(uVar2 >> 0x20)) {
        gc_heap::register_fixup(old_heap,(uint32_t *)this);
        return;
      }
      __assert_fail("reinterpret_cast<uint32_t*>(&repr_)[1] == (nan_bits | (static_cast<uint64_t>(type)+1)<<type_shift)>>32"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/value_representation.cpp"
                    ,0x61,"void mjs::value_representation::fixup(gc_heap &)");
    }
  }
  return;
}

Assistant:

void value_representation::fixup(gc_heap& old_heap) {
    if (!is_special(repr_)) {
        return;
    }
    const auto type = type_from_repr(repr_);
    switch (type) {
    case value_type::undefined: [[fallthrough]];
    case value_type::null:      [[fallthrough]];
    case value_type::boolean:   [[fallthrough]];
    case value_type::number:
        return;
    case value_type::string:    [[fallthrough]];
    case value_type::object:
        // TODO: See note in gc_heap_ptr_untracked about adding a (debug) check for whether fixup was done correctly
        // FIXME: This only works on little endian platforms!
        assert(reinterpret_cast<uint32_t*>(&repr_)[1] == (nan_bits | (static_cast<uint64_t>(type)+1)<<type_shift)>>32);
        old_heap.register_fixup(*reinterpret_cast<uint32_t*>(&repr_));
        break;
    default:
        std::abort();
    }
}